

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>_>
     ::Print(unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>
             *value,ostream *os)

{
  ostream *os_local;
  unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> *value_local
  ;
  
  PrintTo<std::unordered_multiset<bool,std::hash<bool>,std::equal_to<bool>,std::allocator<bool>>>
            (value,os);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }